

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_sasl.c
# Opt level: O1

CURLcode build_message(SASL *sasl,bufref *msg)

{
  CURLcode CVar1;
  uchar *puVar2;
  size_t sVar3;
  code *dtor;
  size_t base64len;
  char *base64;
  size_t local_20;
  char *local_18;
  
  if ((sasl->params->flags & 1) == 0) {
    return CURLE_OK;
  }
  puVar2 = Curl_bufref_ptr(msg);
  if (puVar2 == (uchar *)0x0) {
    local_18 = "";
    local_20 = 0;
  }
  else {
    sVar3 = Curl_bufref_len(msg);
    if (sVar3 != 0) {
      puVar2 = Curl_bufref_ptr(msg);
      sVar3 = Curl_bufref_len(msg);
      CVar1 = Curl_base64_encode((char *)puVar2,sVar3,&local_18,&local_20);
      if (CVar1 != CURLE_OK) {
        return CVar1;
      }
      dtor = curl_free;
      goto LAB_0012154e;
    }
    local_18 = "=";
    local_20 = 1;
  }
  dtor = (_func_void_void_ptr *)0x0;
LAB_0012154e:
  Curl_bufref_set(msg,local_18,local_20,dtor);
  return CURLE_OK;
}

Assistant:

static CURLcode build_message(struct SASL *sasl, struct bufref *msg)
{
  CURLcode result = CURLE_OK;

  if(sasl->params->flags & SASL_FLAG_BASE64) {
    if(!Curl_bufref_ptr(msg))                   /* Empty message. */
      Curl_bufref_set(msg, "", 0, NULL);
    else if(!Curl_bufref_len(msg))              /* Explicit empty response. */
      Curl_bufref_set(msg, "=", 1, NULL);
    else {
      char *base64;
      size_t base64len;

      result = Curl_base64_encode((const char *) Curl_bufref_ptr(msg),
                                  Curl_bufref_len(msg), &base64, &base64len);
      if(!result)
        Curl_bufref_set(msg, base64, base64len, curl_free);
    }
  }

  return result;
}